

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *g;
  
  pIVar5 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == ImGuiNavLayer_Main) {
    pIVar7 = ImGui::NavRestoreLastChildNavWindow(pIVar5->NavWindow);
    pIVar5->NavWindow = pIVar7;
  }
  pIVar6 = GImGui;
  pIVar7 = pIVar5->NavWindow;
  IVar2 = pIVar7->NavLastIds[layer];
  if (IVar2 != 0) {
    GImGui->NavId = IVar2;
    pIVar3 = pIVar6->NavWindow;
    pIVar3->NavLastIds[(int)layer] = IVar2;
    IVar4 = pIVar7->NavRectRel[layer].Max;
    pIVar1 = pIVar3->NavRectRel + (int)layer;
    pIVar1->Min = pIVar7->NavRectRel[layer].Min;
    pIVar1->Max = IVar4;
    pIVar6->NavMousePosDirty = true;
    pIVar6->NavDisableHighlight = false;
    pIVar6->NavDisableMouseHover = true;
    return;
  }
  ImGui::NavInitWindow(pIVar7,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    if (g.NavWindow->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(g.NavWindow->NavLastIds[layer], layer, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}